

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O3

void bssl::dtls_clear_unused_write_epochs(SSL *ssl)

{
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *this;
  byte bVar1;
  DTLS1_STATE *pDVar2;
  DTLS1_STATE *pDVar3;
  pointer __p_00;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  pointer __p;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *pIVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *pIVar12;
  ulong new_size;
  
  pDVar2 = ssl->d1;
  this = &pDVar2->extra_write_epochs;
  bVar8 = (pDVar2->extra_write_epochs).size_;
  uVar6 = (ulong)bVar8;
  pIVar7 = this;
  if (3 < bVar8) {
    bVar1 = (pDVar2->outgoing_messages).size_;
    pIVar12 = this;
    if (bVar1 == 0) {
LAB_0016f2a3:
      if (pIVar12 ==
          (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)
          ((pDVar2->extra_write_epochs).storage_ + (uint)bVar8 * 8)) {
        return;
      }
      new_size = (long)pIVar12 - (long)this >> 3;
      uVar11 = new_size;
      do {
        do {
          uVar5 = uVar11;
          uVar11 = uVar5 + 1;
          if (uVar6 <= uVar11) {
            InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::
            Shrink(this,new_size);
            return;
          }
          pDVar3 = ssl->d1;
          bVar8 = (pDVar3->outgoing_messages).size_;
        } while (bVar8 == 0);
        __p_00 = *(pointer *)(this->storage_ + uVar5 * 8 + 8);
        lVar9 = 0;
        do {
          if ((*(short *)((pDVar3->outgoing_messages).storage_ + lVar9 + 0x10) ==
               *(short *)((long)&(__p_00->next_record).combined_ + 6)) &&
             (((pDVar3->outgoing_messages).storage_[lVar9 + 0x12] != '\0' ||
              (*(long *)((pDVar3->outgoing_messages).storage_ + lVar9 + 0x20) != 0)))) {
            if (uVar6 <= new_size) {
              abort();
            }
            pDVar2->incoming_messages[uVar5 - 2]._M_t.
            super___uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::DTLSIncomingMessage_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false> =
                 (_Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>)0x0;
            std::__uniq_ptr_impl<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)
                       (this->storage_ + new_size * 8),__p_00);
            new_size = new_size + 1;
            uVar6 = (ulong)(pDVar2->extra_write_epochs).size_;
            break;
          }
          lVar9 = lVar9 + 0x30;
        } while ((ulong)bVar8 * 0x30 != lVar9);
      } while( true );
    }
    pIVar7 = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)
             (this->storage_ + ((uint)bVar8 * 8 & 0xffffffe0));
    lVar9 = (ulong)bVar1 * 0x30;
    uVar11 = (ulong)(bVar8 >> 2);
    do {
      lVar10 = 0;
      while ((*(short *)((pDVar2->outgoing_messages).storage_ + lVar10 + 0x10) !=
              *(short *)(*(long *)pIVar12->storage_ + 6) ||
             (((pDVar2->outgoing_messages).storage_[lVar10 + 0x12] == '\0' &&
              (*(long *)((pDVar2->outgoing_messages).storage_ + lVar10 + 0x20) == 0))))) {
        lVar10 = lVar10 + 0x30;
        if (lVar9 == lVar10) goto LAB_0016f2a3;
      }
      lVar10 = 0;
      while ((*(short *)((pDVar2->outgoing_messages).storage_ + lVar10 + 0x10) !=
              *(short *)(*(long *)(pIVar12->storage_ + 8) + 6) ||
             (((pDVar2->outgoing_messages).storage_[lVar10 + 0x12] == '\0' &&
              (*(long *)((pDVar2->outgoing_messages).storage_ + lVar10 + 0x20) == 0))))) {
        lVar10 = lVar10 + 0x30;
        if (lVar9 == lVar10) {
          pIVar12 = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                     *)(pIVar12->storage_ + 8);
          goto LAB_0016f2a3;
        }
      }
      lVar10 = 0;
      while ((*(short *)((pDVar2->outgoing_messages).storage_ + lVar10 + 0x10) !=
              *(short *)(*(long *)&pIVar12->size_ + 6) ||
             (((pDVar2->outgoing_messages).storage_[lVar10 + 0x12] == '\0' &&
              (*(long *)((pDVar2->outgoing_messages).storage_ + lVar10 + 0x20) == 0))))) {
        lVar10 = lVar10 + 0x30;
        if (lVar9 == lVar10) {
          pIVar12 = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                     *)&pIVar12->size_;
          goto LAB_0016f2a3;
        }
      }
      lVar10 = 0;
      while ((*(short *)((pDVar2->outgoing_messages).storage_ + lVar10 + 0x10) !=
              *(short *)&((((UniquePtr<DTLSIncomingMessage> *)(pIVar12 + 1))->_M_t).
                          super___uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>.
                          _M_t.
                          super__Tuple_impl<0UL,_bssl::DTLSIncomingMessage_*,_bssl::internal::Deleter>
                          .super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl)->
                         field_0x6 ||
             (((pDVar2->outgoing_messages).storage_[lVar10 + 0x12] == '\0' &&
              (*(long *)((pDVar2->outgoing_messages).storage_ + lVar10 + 0x20) == 0))))) {
        lVar10 = lVar10 + 0x30;
        if (lVar9 == lVar10) {
          pIVar12 = pIVar12 + 1;
          goto LAB_0016f2a3;
        }
      }
      pIVar12 = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                 *)((UniquePtr<DTLSIncomingMessage> *)(pIVar12 + 1) + 1);
      bVar4 = 1 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar4);
    bVar8 = bVar8 & 3;
  }
  (*(code *)(&DAT_00234704 + *(int *)(&DAT_00234704 + (ulong)bVar8 * 4)))
            (&DAT_00234704 + *(int *)(&DAT_00234704 + (ulong)bVar8 * 4),pIVar7);
  return;
}

Assistant:

void dtls_clear_unused_write_epochs(SSL *ssl) {
  ssl->d1->extra_write_epochs.EraseIf(
      [ssl](const UniquePtr<DTLSWriteEpoch> &write_epoch) -> bool {
        // Non-current epochs may be discarded once there are no incomplete
        // outgoing messages that reference them.
        //
        // TODO(crbug.com/42290594): Epoch 1 (0-RTT) should be retained until
        // epoch 3 (app data) is available.
        for (const auto &msg : ssl->d1->outgoing_messages) {
          if (msg.epoch == write_epoch->epoch() && !msg.IsFullyAcked()) {
            return false;
          }
        }
        return true;
      });
}